

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

TraceFormat cmake::StringToTraceFormat(string *traceStr)

{
  size_t __n;
  pointer ppVar1;
  _Alloc_hider __s2;
  size_type __n_00;
  int iVar2;
  long lVar3;
  TraceOutputFormat TVar4;
  long lVar5;
  pointer ppVar6;
  pointer ppVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>_>
  __l;
  string traceStrLowCase;
  allocator_type local_89;
  TraceOutputFormat local_88 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>
  local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>
  local_58;
  
  if ((StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&StringToTraceFormat(std::__cxx11::string_const&)::
                                   levels_abi_cxx11_), iVar2 != 0)) {
    local_88[1] = 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>
    ::pair<const_char_(&)[6],_cmTraceEnums::TraceOutputFormat,_true>
              (&local_80,(char (*) [6])"human",local_88 + 1);
    local_88[0] = JSONv1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>
    ::pair<const_char_(&)[8],_cmTraceEnums::TraceOutputFormat,_true>
              (&local_58,(char (*) [8])"json-v1",local_88);
    __l._M_len = 2;
    __l._M_array = &local_80;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>_>_>
    ::vector(&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_,__l,&local_89);
    lVar3 = -0x50;
    paVar8 = &local_58.first.field_2;
    do {
      if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar8->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],
                        paVar8->_M_allocated_capacity + 1);
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar8->_M_allocated_capacity + -5);
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0);
    __cxa_atexit(std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>_>_>
                 ::~vector,&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_);
  }
  cmsys::SystemTools::LowerCase(&local_80.first,traceStr);
  __n_00 = local_80.first._M_string_length;
  __s2._M_p = local_80.first._M_dataplus._M_p;
  ppVar1 = StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (lVar3 >> 3) * -0x3333333333333333 >> 2;
  ppVar7 = StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < lVar5) {
    ppVar6 = StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar5 * 4;
    lVar5 = lVar5 + 1;
    ppVar7 = StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTraceEnums::TraceOutputFormat>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
    do {
      if ((__n_00 == ppVar7[-2].first._M_string_length) &&
         ((__n_00 == 0 ||
          (iVar2 = bcmp(ppVar7[-2].first._M_dataplus._M_p,__s2._M_p,__n_00), iVar2 == 0)))) {
        ppVar7 = ppVar7 + -2;
        goto LAB_0026d3be;
      }
      if ((__n_00 == ppVar7[-1].first._M_string_length) &&
         ((__n_00 == 0 ||
          (iVar2 = bcmp(ppVar7[-1].first._M_dataplus._M_p,__s2._M_p,__n_00), iVar2 == 0)))) {
        ppVar7 = ppVar7 + -1;
        goto LAB_0026d3be;
      }
      if ((__n_00 == (ppVar7->first)._M_string_length) &&
         ((__n_00 == 0 ||
          (iVar2 = bcmp((ppVar7->first)._M_dataplus._M_p,__s2._M_p,__n_00), iVar2 == 0))))
      goto LAB_0026d3be;
      if ((__n_00 == ppVar7[1].first._M_string_length) &&
         ((__n_00 == 0 ||
          (iVar2 = bcmp(ppVar7[1].first._M_dataplus._M_p,__s2._M_p,__n_00), iVar2 == 0)))) {
        ppVar7 = ppVar7 + 1;
        goto LAB_0026d3be;
      }
      lVar5 = lVar5 + -1;
      ppVar7 = ppVar7 + 4;
    } while (1 < lVar5);
    lVar3 = (long)ppVar1 - (long)ppVar6;
    ppVar7 = ppVar6;
  }
  lVar3 = (lVar3 >> 3) * -0x3333333333333333;
  TVar4 = Undefined;
  if (lVar3 == 3) {
    __n = (ppVar7->first)._M_string_length;
    if ((local_80.first._M_string_length != __n) ||
       ((__n != 0 &&
        (iVar2 = bcmp((ppVar7->first)._M_dataplus._M_p,local_80.first._M_dataplus._M_p,__n),
        iVar2 != 0)))) {
      ppVar7 = ppVar7 + 1;
      goto LAB_0026d36f;
    }
  }
  else {
    if (lVar3 == 2) {
LAB_0026d36f:
      if ((local_80.first._M_string_length == (ppVar7->first)._M_string_length) &&
         ((local_80.first._M_string_length == 0 ||
          (iVar2 = bcmp((ppVar7->first)._M_dataplus._M_p,local_80.first._M_dataplus._M_p,
                        local_80.first._M_string_length), iVar2 == 0)))) goto LAB_0026d3be;
      ppVar7 = ppVar7 + 1;
    }
    else if (lVar3 != 1) goto LAB_0026d3cc;
    if ((local_80.first._M_string_length != (ppVar7->first)._M_string_length) ||
       ((local_80.first._M_string_length != 0 &&
        (iVar2 = bcmp((ppVar7->first)._M_dataplus._M_p,local_80.first._M_dataplus._M_p,
                      local_80.first._M_string_length), TVar4 = Undefined, iVar2 != 0))))
    goto LAB_0026d3cc;
  }
LAB_0026d3be:
  if (ppVar7 == ppVar1) {
    TVar4 = Undefined;
  }
  else {
    TVar4 = ppVar7->second;
  }
LAB_0026d3cc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
    operator_delete(local_80.first._M_dataplus._M_p,local_80.first.field_2._M_allocated_capacity + 1
                   );
  }
  return TVar4;
}

Assistant:

cmake::TraceFormat cmake::StringToTraceFormat(const std::string& traceStr)
{
  using TracePair = std::pair<std::string, TraceFormat>;
  static const std::vector<TracePair> levels = {
    { "human", TraceFormat::Human },
    { "json-v1", TraceFormat::JSONv1 },
  };

  const auto traceStrLowCase = cmSystemTools::LowerCase(traceStr);

  const auto it = std::find_if(levels.cbegin(), levels.cend(),
                               [&traceStrLowCase](const TracePair& p) {
                                 return p.first == traceStrLowCase;
                               });
  return (it != levels.cend()) ? it->second : TraceFormat::Undefined;
}